

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O0

void __thiscall front::symbol::VoidSymbol::VoidSymbol(VoidSymbol *this)

{
  undefined8 *in_RDI;
  string *name;
  Symbol *in_stack_ffffffffffffffc0;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  name = (string *)&local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,(char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  Symbol::Symbol(in_stack_ffffffffffffffc0,name,(int)((ulong)in_RDI >> 0x20));
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  *in_RDI = &PTR_kind_0036fa18;
  return;
}

Assistant:

VoidSymbol() : Symbol("void", -1) {}